

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall
Jinx::Impl::Runtime::RegisterFunction
          (Runtime *this,FunctionSignature *signature,BufferPtr *bytecode,size_t offset)

{
  RuntimeID local_78;
  pair<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_> local_70;
  undefined1 local_41 [9];
  shared_ptr<Jinx::Impl::FunctionDefinition> functionDefPtr;
  lock_guard<std::mutex> lock;
  size_t offset_local;
  BufferPtr *bytecode_local;
  FunctionSignature *signature_local;
  Runtime *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             &functionDefPtr.
              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&this->m_functionMutex);
  Allocator<Jinx::Impl::FunctionDefinition>::Allocator
            ((Allocator<Jinx::Impl::FunctionDefinition> *)local_41);
  std::
  allocate_shared<Jinx::Impl::FunctionDefinition,Jinx::Allocator<Jinx::Impl::FunctionDefinition>,Jinx::Impl::FunctionSignature_const&,std::shared_ptr<Jinx::Buffer>const&,unsigned_long&>
            ((Allocator<Jinx::Impl::FunctionDefinition> *)(local_41 + 1),
             (FunctionSignature *)local_41,(shared_ptr<Jinx::Buffer> *)signature,
             (unsigned_long *)bytecode);
  local_78 = FunctionSignature::GetId(signature);
  std::make_pair<unsigned_long,std::shared_ptr<Jinx::Impl::FunctionDefinition>&>
            (&local_70,&local_78,(shared_ptr<Jinx::Impl::FunctionDefinition> *)(local_41 + 1));
  std::
  map<unsigned_long,std::shared_ptr<Jinx::Impl::FunctionDefinition>,std::less<unsigned_long>,Jinx::StaticAllocator<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,4096ul,16ul>>
  ::insert<std::pair<unsigned_long,std::shared_ptr<Jinx::Impl::FunctionDefinition>>>
            ((map<unsigned_long,std::shared_ptr<Jinx::Impl::FunctionDefinition>,std::less<unsigned_long>,Jinx::StaticAllocator<std::pair<unsigned_long_const,std::shared_ptr<Jinx::Impl::FunctionDefinition>>,4096ul,16ul>>
              *)&this->m_functionMap,&local_70);
  std::pair<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>::~pair(&local_70);
  std::shared_ptr<Jinx::Impl::FunctionDefinition>::~shared_ptr
            ((shared_ptr<Jinx::Impl::FunctionDefinition> *)(local_41 + 1));
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)
             &functionDefPtr.
              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

inline void Runtime::RegisterFunction(const FunctionSignature & signature, const BufferPtr & bytecode, size_t offset)
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto functionDefPtr = std::allocate_shared<FunctionDefinition>(Allocator<FunctionDefinition>(), signature, bytecode, offset);
		m_functionMap.insert(std::make_pair(signature.GetId(), functionDefPtr));
	}